

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O2

void __thiscall
tcu::TestHierarchyIterator::TestHierarchyIterator
          (TestHierarchyIterator *this,TestPackageRoot *rootNode,TestHierarchyInflater *inflater,
          CaseListFilter *caseListFilter)

{
  value_type local_48;
  
  this->m_inflater = inflater;
  this->m_caseListFilter = caseListFilter;
  (this->m_sessionStack).
  super__Vector_base<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sessionStack).
  super__Vector_base<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sessionStack).
  super__Vector_base<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_nodePath)._M_dataplus._M_p = (pointer)&(this->m_nodePath).field_2;
  (this->m_nodePath)._M_string_length = 0;
  (this->m_nodePath).field_2._M_local_buf[0] = '\0';
  local_48.children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.curChildNdx = -1;
  local_48.m_state = STATE_ENTER;
  local_48.node = &rootNode->super_TestNode;
  std::
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  ::push_back(&this->m_sessionStack,&local_48);
  next(this);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            (&local_48.children.
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
  return;
}

Assistant:

TestHierarchyIterator::TestHierarchyIterator (TestPackageRoot&			rootNode,
											  TestHierarchyInflater&	inflater,
											  const CaseListFilter&		caseListFilter)
	: m_inflater		(inflater)
	, m_caseListFilter	(caseListFilter)
{
	// Init traverse state and "seek" to first reportable node.
	NodeIter iter(&rootNode);
	iter.setState(NodeIter::STATE_ENTER); // Root is never reported
	m_sessionStack.push_back(iter);
	next();
}